

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_tiled_irreg_proc_grid(Integer g_a,Integer *mapc,Integer *nblocks,Integer *proc_grid)

{
  ushort uVar1;
  global_array_t *pgVar2;
  ulong uVar3;
  C_Integer *pCVar4;
  long lVar5;
  long lVar6;
  long icode;
  global_array_t *pgVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar10 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set irregular tiled data distribution on array that has been allocated",0);
  }
  if ((GA[lVar10].ndim < 1) &&
     (pnga_error("Cannot set irregular tiled data distribution if array size not set",0),
     GA[lVar10].ndim < 1)) {
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  }
  pgVar7 = GA;
  for (lVar8 = 0; lVar8 < pgVar7[lVar10].ndim; lVar8 = lVar8 + 1) {
    if (pgVar7[g_a + 1000].dims[lVar8] < nblocks[lVar8]) {
      pnga_error("number of blocks must be <= corresponding dimension",lVar8);
      pgVar7 = GA;
    }
  }
  if (pgVar7[lVar10].distr_type != 0) {
    pnga_error("Cannot reset irregular tiled data distribution on array that has been set",0);
    pgVar7 = GA;
  }
  pgVar7[lVar10].distr_type = 4;
  lVar8 = 0;
  for (lVar9 = 0; uVar3 = (ulong)pgVar7[lVar10].ndim, lVar9 < (long)uVar3; lVar9 = lVar9 + 1) {
    lVar5 = mapc[lVar8];
    if ((lVar5 < 1) || (pgVar7[lVar10].dims[lVar9] + 1 < lVar5)) {
      pnga_error("Mapc entry outside array dimension limits",lVar5);
    }
    for (lVar6 = 1; lVar6 < nblocks[lVar9]; lVar6 = lVar6 + 1) {
      icode = mapc[lVar8 + lVar6];
      if (icode < lVar5) {
        pnga_error("Mapc entries are not properly monotonic",lVar5);
        icode = mapc[lVar8 + lVar6];
      }
      if ((icode < 1) || (GA[lVar10].dims[lVar9] + 1 < icode)) {
        pnga_error("Mapc entry outside array dimension limits",icode);
      }
      lVar5 = icode;
    }
    lVar8 = lVar8 + lVar6;
    pgVar7 = GA;
  }
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < (short)uVar3; lVar8 = lVar8 + 1) {
    lVar5 = nblocks[lVar8];
    pgVar7[g_a + 1000].num_blocks[lVar8] = lVar5;
    lVar6 = proc_grid[lVar8];
    if (lVar6 < 1) {
      pnga_error("Processor grid dimensions must all be greater than zero",0);
      lVar6 = proc_grid[lVar8];
      uVar3 = (ulong)(ushort)GA[lVar10].ndim;
      pgVar7 = GA;
    }
    lVar9 = lVar9 + lVar5;
    pgVar7[g_a + 1000].nblock[lVar8] = (int)lVar6;
  }
  pCVar4 = (C_Integer *)malloc(lVar9 * 8 + 8);
  pgVar7[lVar10].mapc = pCVar4;
  pgVar2 = GA;
  pgVar7 = GA + lVar10;
  lVar5 = 0;
  lVar8 = 0;
  if (0 < lVar9) {
    lVar8 = lVar9;
  }
  for (; lVar8 != lVar5; lVar5 = lVar5 + 1) {
    pgVar7->mapc[lVar5] = mapc[lVar5];
  }
  pgVar7->mapc[lVar9] = -1;
  pgVar2[lVar10].irreg = 1;
  uVar1 = pgVar2[lVar10].ndim;
  uVar3 = 0;
  if ((short)uVar1 < 1) {
    uVar1 = 0;
  }
  lVar8 = 1;
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    lVar8 = lVar8 * pgVar2[lVar10].num_blocks[uVar3];
  }
  pgVar2[lVar10].block_total = lVar8;
  return;
}

Assistant:

void pnga_set_tiled_irreg_proc_grid(Integer g_a, Integer *mapc, Integer *nblocks,
    Integer *proc_grid)
{
  Integer i, j, ichk, maplen, jsize;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set irregular tiled data distribution on array"
        " that has been allocated",0);
  if (!(GA[ga_handle].ndim > 0))
    pnga_error("Cannot set irregular tiled data distribution if array size not set",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++)
    if ((C_Integer)nblocks[i] > GA[ga_handle].dims[i])
      pnga_error("number of blocks must be <= corresponding dimension",i);
  if (GA[ga_handle].distr_type != REGULAR)
    pnga_error("Cannot reset irregular tiled data distribution on array that has been set",0);
  GA[ga_handle].distr_type = TILED_IRREG;
  /* Check to see that mapc array is sensible */
  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    ichk = mapc[maplen];
    if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
      pnga_error("Mapc entry outside array dimension limits",ichk);
    maplen++;
    for (j=1; j<nblocks[i]; j++) {
      if (mapc[maplen] < ichk) {
        pnga_error("Mapc entries are not properly monotonic",ichk);
      }
      ichk = mapc[maplen];
      if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
        pnga_error("Mapc entry outside array dimension limits",ichk);
      maplen++;
    }
  }

  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    maplen += nblocks[i];
    GA[ga_handle].num_blocks[i] = (C_Integer)nblocks[i];
    if (proc_grid[i] < 1)
      pnga_error("Processor grid dimensions must all be greater than zero",0);
    GA[ga_handle].nblock[i] = proc_grid[i];
  }
  GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
  for (i=0; i<maplen; i++) {
    GA[ga_handle].mapc[i] = (C_Integer)mapc[i];
  }
  GA[ga_handle].mapc[maplen] = -1;
  GA[ga_handle].irreg = 1;

  /* Find total number of blocks */
  jsize = 1;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    jsize *= GA[ga_handle].num_blocks[i];
  }
  GA[ga_handle].block_total = jsize;
}